

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O3

void kb_trans(u_short keycode,u_short upflg)

{
  DLword DVar1;
  ulong uVar2;
  ushort uVar3;
  byte bVar4;
  
  bVar4 = (byte)keycode;
  if (keycode < 0x40) {
    uVar3 = (ushort)(1 << (~bVar4 & 0xf));
    if (upflg == 0) {
      uVar2 = ((ulong)EmKbdAd068K ^ 2) + (ulong)(keycode >> 3 & 6);
LAB_00128c38:
      *(ushort *)(uVar2 ^ 2) = *(ushort *)(uVar2 ^ 2) & ~uVar3;
      return;
    }
    uVar2 = ((ulong)EmKbdAd068K ^ 2) + (ulong)(keycode >> 3 & 6);
  }
  else {
    if (keycode < 0x50) {
      uVar3 = (ushort)(1 << (~bVar4 & 0xf));
      if (upflg == 0) {
        *EmRealUtilin68K = *EmRealUtilin68K & ~uVar3;
        DVar1 = ~uVar3 & *EmUtilin68K;
      }
      else {
        *EmRealUtilin68K = *EmRealUtilin68K | uVar3;
        DVar1 = uVar3 | *EmUtilin68K;
      }
      *EmUtilin68K = DVar1;
      return;
    }
    uVar3 = (ushort)(1 << (~bVar4 & 0xf));
    if (upflg == 0) {
      uVar2 = ((ulong)EmKbdAd068K ^ 2) + (ulong)((keycode - 0x10 & 0xffff) >> 4) * 2;
      goto LAB_00128c38;
    }
    uVar2 = ((ulong)EmKbdAd068K ^ 2) + (ulong)((keycode - 0x10 & 0xffff) >> 4) * 2;
  }
  *(ushort *)(uVar2 ^ 2) = *(ushort *)(uVar2 ^ 2) | uVar3;
  return;
}

Assistant:

void kb_trans(u_short keycode, u_short upflg)
{
  if (keycode < 64) /* DLKBDAD0 ~ 3	*/
  {
    PUTBASEBIT68K(EmKbdAd068K, keycode, upflg);
  } else if (keycode >= 80) /* DLKBDAD4, 5	*/
  {
    PUTBASEBIT68K(EmKbdAd068K, keycode - 16, upflg);
  } else if (keycode >= 64 && keycode < 80) /* DLUTILIN	*/
  {
    PUTBASEBIT68K(EmRealUtilin68K, (keycode & 15), upflg);
    PUTBASEBIT68K(EmUtilin68K, (keycode & 15), upflg);
  }
}